

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_math.c
# Opt level: O2

size_t ares_pow(size_t x,size_t y)

{
  size_t sVar1;
  size_t sVar2;
  
  sVar1 = 1;
  for (; y != 0; y = y >> 1) {
    sVar2 = x;
    if ((y & 1) == 0) {
      sVar2 = 1;
    }
    sVar1 = sVar1 * sVar2;
    x = x * x;
  }
  return sVar1;
}

Assistant:

size_t ares_pow(size_t x, size_t y)
{
  size_t res = 1;

  while (y > 0) {
    /* If y is odd, multiply x with result */
    if (y & 1) {
      res = res * x;
    }

    /* y must be even now */
    y = y >> 1; /* y /= 2; */
    x = x * x;  /* x^2 */
  }

  return res;
}